

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mad.cpp
# Opt level: O3

RESULT_TYPE __thiscall
duckdb::MadAccessor<duckdb::date_t,_duckdb::interval_t,_duckdb::timestamp_t>::operator()
          (MadAccessor<duckdb::date_t,_duckdb::interval_t,_duckdb::timestamp_t> *this,
          INPUT_TYPE *input)

{
  date_t input_00;
  bool bVar1;
  int64_t delta_us;
  undefined1 auVar2 [12];
  interval_t iVar3;
  RESULT_TYPE RVar4;
  timestamp_t dt;
  timestamp_t local_48;
  string local_40;
  undefined1 auVar5 [12];
  int64_t iVar6;
  
  input_00.days = input->days;
  bVar1 = TryCast::Operation<duckdb::date_t,duckdb::timestamp_t>(input_00,&local_48,false);
  if (bVar1) {
    delta_us = timestamp_t::operator-(&local_48,this->median);
    if (delta_us < 1) {
      delta_us = -delta_us;
    }
    iVar3 = Interval::FromMicro(delta_us);
    RVar4.months = iVar3.months;
    auVar5._4_4_ = iVar3.days;
    register0x00000010 = iVar3.micros;
    return RVar4;
  }
  auVar2 = __cxa_allocate_exception(0x10);
  CastExceptionText<duckdb::date_t,duckdb::timestamp_t>
            (&local_40,(duckdb *)(ulong)(uint)input_00.days,(date_t)auVar2._8_4_);
  InvalidInputException::InvalidInputException(auVar2._0_8_,(string *)&local_40);
  __cxa_throw(auVar2._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

inline RESULT_TYPE operator()(const INPUT_TYPE &input) const {
		const auto dt = Cast::Operation<date_t, timestamp_t>(input);
		const auto delta = dt - median;
		return Interval::FromMicro(TryAbsOperator::Operation<int64_t, int64_t>(delta));
	}